

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_get_max_min_partition_features
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,float *features)

{
  BLOCK_SIZE BVar1;
  int16_t iVar2;
  int iVar3;
  int_mv iVar4;
  uint uVar5;
  undefined4 in_register_00000014;
  int this_mi_col;
  int mi_col_00;
  int ref;
  ulong uVar6;
  float fVar7;
  float extraout_XMM0_Db;
  float fVar8;
  undefined8 uVar9;
  float fVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar13;
  float fVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  uint sse;
  uint local_c8;
  uint local_c4;
  float local_c0;
  int local_bc;
  int local_b8;
  uint local_b4;
  int local_b0;
  float local_ac;
  float local_a8;
  uint var;
  float *local_a0;
  undefined8 local_98;
  ulong local_90;
  ulong local_88;
  MACROBLOCK *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  local_98 = CONCAT44(in_register_00000014,mi_row);
  BVar1 = ((cpi->common).seq_params)->sb_size;
  uVar6 = (ulong)BVar1;
  local_b8 = mi_col;
  local_a0 = features;
  iVar2 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
  iVar3 = (int)iVar2 >> ((char)(x->e_mbd).bd - 8U & 0x1f);
  local_80 = x;
  local_c0 = log1pf((float)(iVar3 * iVar3) * 0.00390625);
  local_c4 = (uint)(block_size_high[uVar6] >> 4);
  local_c8 = (uint)(block_size_wide[uVar6] >> 4);
  if ((0xa002fUL >> (uVar6 & 0x3f) & 1) == 0) {
    local_90 = 0x5001fL >> (BVar1 & 0x3f);
    local_bc = local_c8 + (local_c8 == 0);
    local_b4 = local_c4 + (local_c4 == 0);
    local_78 = 0x7f7fffff;
    uStack_74 = 0x7f7fffff;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68 = 0.0;
    fStack_64 = 0.0;
    fStack_60 = 0.0;
    fStack_5c = 3.4028235e+38;
    _local_48 = ZEXT816(0);
    local_a8 = 0.0;
    local_ac = 0.0;
    local_88 = 0;
    _local_58 = ZEXT816(0);
    do {
      if ((local_90 & 1) == 0) {
        local_b0 = (int)local_98 + (int)local_88 * 4;
        iVar3 = local_bc;
        mi_col_00 = local_b8;
        do {
          sse = 0;
          var = 0;
          ref = 1;
          if ((cpi->rc).is_src_frame_alt_ref != 0) {
            ref = 7;
          }
          iVar4 = av1_simple_motion_search_sse_var
                            (cpi,local_80,local_b0,mi_col_00,BLOCK_16X16,ref,(FULLPEL_MV)0x0,1,0,
                             &sse,&var);
          fVar7 = log1pf((float)sse);
          fVar8 = (float)((int)(((uint)((int)iVar4.as_int >> 0x10) >> 0x1d) +
                               ((int)iVar4.as_int >> 0x10)) >> 3);
          fVar12 = (float)((int)(((uint)(int)iVar4.as_mv.row >> 0x1d) + (int)iVar4.as_mv.row) >> 3);
          fVar13 = ABS(fVar8);
          fVar15 = ABS(fVar12);
          local_ac = local_ac + fVar12;
          local_a8 = local_a8 + fVar12 * fVar12;
          local_48._0_4_ = (float)local_48._0_4_ + fVar7;
          local_48._4_4_ = (float)local_48._4_4_ + fVar8;
          fStack_40 = fStack_40 + extraout_XMM0_Db;
          fStack_3c = fStack_3c + fVar12;
          local_58._0_4_ = (float)local_58._0_4_ + fVar7 * fVar7;
          local_58._4_4_ = (float)local_58._4_4_ + fVar8 * fVar8;
          fStack_50 = fStack_50 + extraout_XMM0_Db * extraout_XMM0_Db;
          fStack_4c = fStack_4c + fVar12 * fVar12;
          auVar10._0_8_ = CONCAT44(fVar7,fVar12) & 0xffffffff7fffffff;
          auVar10._8_4_ = fVar15;
          auVar10._12_4_ = fVar15;
          auVar16._4_4_ = uStack_74;
          auVar16._0_4_ = local_78;
          auVar16._8_4_ = uStack_70;
          auVar16._12_4_ = uStack_6c;
          auVar11 = minps(auVar10,auVar16);
          local_68 = (float)(~-(uint)(local_68 < fVar13) & (uint)local_68 |
                            (uint)fVar13 & -(uint)(local_68 < fVar13));
          fStack_64 = (float)(~-(uint)(fStack_64 < fVar15) & (uint)fStack_64 |
                             (uint)fVar15 & -(uint)(fStack_64 < fVar15));
          fStack_60 = (float)(~-(uint)(fStack_60 < fVar7) & (uint)fStack_60 |
                             (uint)fVar7 & -(uint)(fStack_60 < fVar7));
          fStack_5c = (float)(~-(uint)(fVar13 < fStack_5c) & (uint)fStack_5c |
                             (uint)fVar13 & -(uint)(fVar13 < fStack_5c));
          mi_col_00 = mi_col_00 + 4;
          local_78 = auVar11._0_4_;
          uStack_74 = auVar11._4_4_;
          uStack_70 = auVar11._8_4_;
          uStack_6c = auVar11._12_4_;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      else {
        auVar11._4_4_ = uStack_74;
        auVar11._0_4_ = local_78;
        auVar11._8_4_ = uStack_70;
        auVar11._12_4_ = uStack_6c;
      }
      uVar9 = auVar11._0_8_;
      uVar5 = (int)local_88 + 1;
      local_88 = (ulong)uVar5;
      local_78 = auVar11._0_4_;
      uStack_74 = auVar11._4_4_;
      uStack_70 = auVar11._8_4_;
      uStack_6c = auVar11._12_4_;
    } while (uVar5 != local_b4);
  }
  else {
    uVar9 = 0x7f7fffff7f7fffff;
    local_68 = 0.0;
    fStack_64 = 0.0;
    fStack_60 = 0.0;
    fStack_5c = 3.4028235e+38;
    _local_48 = ZEXT816(0);
    local_ac = 0.0;
    local_a8 = 0.0;
    _local_58 = ZEXT816(0);
  }
  auVar14._0_4_ = (float)(int)(local_c8 * local_c4);
  local_ac = local_ac / auVar14._0_4_;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  auVar11 = divps(_local_48,auVar14);
  *(long *)local_a0 = auVar11._0_8_;
  local_a0[2] = local_ac;
  local_a0[3] = local_c0;
  local_a0[4] = local_68;
  local_a0[5] = fStack_64;
  local_a0[6] = fStack_60;
  local_a0[7] = fStack_5c;
  auVar16 = divps(_local_58,auVar14);
  *(undefined8 *)(local_a0 + 8) = uVar9;
  *(ulong *)(local_a0 + 10) =
       CONCAT44(auVar16._4_4_ - auVar11._4_4_ * auVar11._4_4_,
                auVar16._0_4_ - auVar11._0_4_ * auVar11._0_4_);
  local_a0[0xc] = local_a8 / auVar14._0_4_ - local_ac * local_ac;
  return;
}

Assistant:

void av1_get_max_min_partition_features(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        float *features) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  // Currently this only allows 128X128 SB size. May extend it to 64X64 SB size.
  assert(sb_size == BLOCK_128X128);

  int f_idx = 0;

  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  const float log_q_sq = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Perform full-pixel single motion search in Y plane of 16x16 mbs in the sb
  float sum_mv_row_sq = 0;
  float sum_mv_row = 0;
  float min_abs_mv_row = FLT_MAX;
  float max_abs_mv_row = 0;

  float sum_mv_col_sq = 0;
  float sum_mv_col = 0;
  float min_abs_mv_col = FLT_MAX;
  float max_abs_mv_col = 0;

  float sum_log_sse_sq = 0;
  float sum_log_sse = 0;
  float min_log_sse = FLT_MAX;
  float max_log_sse = 0;

  const BLOCK_SIZE mb_size = BLOCK_16X16;
  const int mb_rows = block_size_high[sb_size] / block_size_high[mb_size];
  const int mb_cols = block_size_wide[sb_size] / block_size_wide[mb_size];
  const int mb_in_mi_size_high_log2 = mi_size_high_log2[mb_size];
  const int mb_in_mi_size_wide_log2 = mi_size_wide_log2[mb_size];

  for (int mb_row = 0; mb_row < mb_rows; mb_row++)
    for (int mb_col = 0; mb_col < mb_cols; mb_col++) {
      const int this_mi_row = mi_row + (mb_row << mb_in_mi_size_high_log2);
      const int this_mi_col = mi_col + (mb_col << mb_in_mi_size_wide_log2);
      unsigned int sse = 0;
      unsigned int var = 0;
      const FULLPEL_MV start_mv = kZeroFullMv;
      const MV_REFERENCE_FRAME ref =
          cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME : LAST_FRAME;
      const int_mv best_mv = av1_simple_motion_search_sse_var(
          cpi, x, this_mi_row, this_mi_col, mb_size, ref, start_mv, 1, 0, &sse,
          &var);

      const float mv_row = (float)(best_mv.as_mv.row / 8);
      const float mv_col = (float)(best_mv.as_mv.col / 8);
      const float log_sse = log1pf((float)sse);
      const float abs_mv_row = fabsf(mv_row);
      const float abs_mv_col = fabsf(mv_col);

      sum_mv_row_sq += mv_row * mv_row;
      sum_mv_row += mv_row;
      sum_mv_col_sq += mv_col * mv_col;
      sum_mv_col += mv_col;

      if (abs_mv_row < min_abs_mv_row) min_abs_mv_row = abs_mv_row;
      if (abs_mv_row > max_abs_mv_row) max_abs_mv_row = abs_mv_row;
      if (abs_mv_col < min_abs_mv_col) min_abs_mv_col = abs_mv_col;
      if (abs_mv_col > max_abs_mv_col) max_abs_mv_col = abs_mv_col;

      sum_log_sse_sq += log_sse * log_sse;
      sum_log_sse += log_sse;
      if (log_sse < min_log_sse) min_log_sse = log_sse;
      if (log_sse > max_log_sse) max_log_sse = log_sse;
    }
  const int blks = mb_rows * mb_cols;
  const float avg_mv_row = sum_mv_row / (float)blks;
  const float var_mv_row =
      sum_mv_row_sq / (float)blks - avg_mv_row * avg_mv_row;

  const float avg_mv_col = sum_mv_col / (float)blks;
  const float var_mv_col =
      sum_mv_col_sq / (float)blks - avg_mv_col * avg_mv_col;

  const float avg_log_sse = sum_log_sse / (float)blks;
  const float var_log_sse =
      sum_log_sse_sq / (float)blks - avg_log_sse * avg_log_sse;

  features[f_idx++] = avg_log_sse;
  features[f_idx++] = avg_mv_col;
  features[f_idx++] = avg_mv_row;
  features[f_idx++] = log_q_sq;
  features[f_idx++] = max_abs_mv_col;
  features[f_idx++] = max_abs_mv_row;
  features[f_idx++] = max_log_sse;
  features[f_idx++] = min_abs_mv_col;
  features[f_idx++] = min_abs_mv_row;
  features[f_idx++] = min_log_sse;
  features[f_idx++] = var_log_sse;
  features[f_idx++] = var_mv_col;
  features[f_idx++] = var_mv_row;

  assert(f_idx == FEATURE_SIZE_MAX_MIN_PART_PRED);
}